

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SerializedModel::SerializeWithCachedSizes
          (SerializedModel *this,CodedOutputStream *output)

{
  int size;
  long lVar1;
  char *data;
  string *psVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SerializedModel *this_local;
  
  identifier_abi_cxx11_(this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    identifier_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    identifier_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.SerializedModel.identifier");
    psVar2 = identifier_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar2,output);
  }
  model_abi_cxx11_(this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    psVar2 = model_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(2,psVar2,output);
  }
  return;
}

Assistant:

void SerializedModel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SerializedModel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string identifier = 1;
  if (this->identifier().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->identifier().data(), this->identifier().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.SerializedModel.identifier");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->identifier(), output);
  }

  // bytes model = 2;
  if (this->model().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      2, this->model(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SerializedModel)
}